

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifsay(bifcxdef *ctx,int argc)

{
  char cVar1;
  long lVar2;
  long in_RDI;
  char numbuf [30];
  long num;
  uchar *str;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  runcxdef *in_stack_ffffffffffffffa0;
  char local_48 [40];
  undefined8 local_20;
  tiocxdef *local_18;
  
  cVar1 = *(char *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + -0x10);
  if (cVar1 == '\x01') {
    lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
    if (*(char *)(lVar2 + -0x10) != '\x01') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    }
    local_20 = *(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    sprintf(local_48,"%ld",local_20);
    outformat((char *)in_stack_ffffffffffffffa0);
  }
  else if (cVar1 == '\x03') {
    lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
    if (*(char *)(lVar2 + -0x10) != '\x03') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    }
    local_18 = *(tiocxdef **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    outfmt(local_18,(uchar *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  else {
    if (cVar1 != '\x05') {
      *(char **)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x18) = "say";
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 1;
      runsign(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    }
    lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
    if ((*(char *)(lVar2 + -0x10) != '\b') && (**(char **)(*(long *)(in_RDI + 8) + 0x20) != '\x05'))
    {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    }
  }
  return;
}

Assistant:

void bifsay(bifcxdef *ctx, int argc)
{
    uchar *str;
    long   num;
    char   numbuf[30];

    if (argc != 2) bifcntargs(ctx, 1, argc);
    
    switch(runtostyp(ctx->bifcxrun))
    {
    case DAT_NUMBER:
        num = runpopnum(ctx->bifcxrun);
        sprintf(numbuf, "%ld", num);
        tioputs(ctx->bifcxtio, numbuf);
        break;
        
    case DAT_SSTRING:
        str = runpopstr(ctx->bifcxrun);
        outfmt(ctx->bifcxtio, str);
        break;
        
    case DAT_NIL:
        (void)runpoplog(ctx->bifcxrun);
        break;
        
    default:
        runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "say");
    }
}